

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_Deinit(void)

{
  undefined1 local_9;
  
  if (isInit == '\0') {
    local_9 = '\x18';
  }
  else {
    deviceList.devCount = 0;
    deviceList.devNames = (char **)0x0;
    isInit = '\0';
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

UINT8 Pulse_Deinit(void)
{
	if (! isInit)
		return AERR_WASDONE;
	
	deviceList.devCount = 0;
	deviceList.devNames = NULL;
	
	isInit = 0;
	
	return AERR_OK;
}